

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O1

size_t Jupiter_base64decode(char *in,uchar *out)

{
  byte bVar1;
  uchar *puVar2;
  sbyte sVar3;
  ulong uVar4;
  ulong uVar5;
  uchar *puVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  puVar2 = out;
  uVar4 = 1;
  do {
    uVar9 = uVar4;
    if ((long)*in == 0) goto LAB_00123b56;
    bVar1 = "BBBBBBBBB@BBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBBB>BBB?456789:;<=BBBABBB"[*in];
    if (bVar1 == 0x40) {
      iVar7 = 0;
    }
    else if (bVar1 == 0x42) {
      iVar7 = 1;
    }
    else if (bVar1 == 0x41) {
      iVar7 = 5;
    }
    else {
      uVar5 = uVar4 << 6;
      uVar9 = bVar1 | uVar5;
      iVar7 = 0;
      if (((uint)uVar4 >> 0x12 & 1) != 0) {
        *puVar2 = (uchar)(uVar5 >> 0x10);
        puVar2[1] = (uchar)(uVar5 >> 8);
        puVar2[2] = (uchar)uVar9;
        puVar2 = puVar2 + 3;
        uVar9 = 1;
        iVar7 = 0;
      }
    }
    in = in + 1;
    uVar4 = uVar9;
  } while (iVar7 == 0);
  if (iVar7 != 5) {
    return 0;
  }
LAB_00123b56:
  if (((uint)uVar9 >> 0x12 & 1) == 0) {
    if (((uint)uVar9 >> 0xc & 1) == 0) goto LAB_00123b90;
    lVar8 = 1;
    sVar3 = 4;
    puVar6 = puVar2;
  }
  else {
    puVar6 = puVar2 + 1;
    *puVar2 = (uchar)(uVar9 >> 10);
    sVar3 = 2;
    lVar8 = 2;
  }
  puVar2 = puVar2 + lVar8;
  *puVar6 = (uchar)(uVar9 >> sVar3);
LAB_00123b90:
  return (long)puVar2 - (long)out;
}

Assistant:

size_t Jupiter_base64decode(const char *in, unsigned char *out)
{
	unsigned char *outOrig = out;
	size_t buf = 1;

	while (*in != 0)
	{
		unsigned char c = Jupiter_base64DecodeTable[*in++];

		switch (c)
		{
		case 66:
			/* invalid input */
			return 0;
		case 65:
			/* pad character, end of data */
			goto endLoop;
		case 64:
			break;
		default:
			buf = buf << 6 | c;

			/* If the buffer is full, split it into bytes */
			if (buf & 0x1000000)
			{
				*out++ = (unsigned char)(buf >> 16);
				*out++ = (unsigned char)(buf >> 8);
				*out++ = (unsigned char)buf;
				buf = 1;
			}
			break;
		}
	}
endLoop:

	if (buf & 0x40000)
	{
		*out++ = (unsigned char)(buf >> 10);
		*out++ = (unsigned char)(buf >> 2);
	}
	else if (buf & 0x1000) *out++ = (unsigned char)(buf >> 4);

	return out - outOrig;
}